

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int xmlwrite_string_attr
              (archive_write *a,xml_writer *writer,char *key,char *value,char *attrkey,
              char *attrvalue)

{
  uint uVar1;
  char *fmt;
  
  uVar1 = xmlTextWriterStartElement(writer->writer,key);
  if ((int)uVar1 < 0) {
    fmt = "xml_writer_start_element() failed: %d";
  }
  else if ((attrvalue == (char *)0x0 || attrkey == (char *)0x0) ||
          (uVar1 = xmlTextWriterWriteAttribute(writer->writer,attrkey,attrvalue), -1 < (int)uVar1))
  {
    if ((value == (char *)0x0) ||
       (uVar1 = xmlTextWriterWriteString(writer->writer,value), -1 < (int)uVar1)) {
      uVar1 = xmlTextWriterEndElement(writer->writer);
      if (-1 < (int)uVar1) {
        return 0;
      }
      fmt = "xml_writer_end_element() failed: %d";
    }
    else {
      fmt = "xml_writer_write_string() failed: %d";
    }
  }
  else {
    fmt = "xml_writer_write_attribute() failed: %d";
  }
  archive_set_error(&a->archive,-1,fmt,(ulong)uVar1);
  return -0x1e;
}

Assistant:

static int
xmlwrite_string_attr(struct archive_write *a, struct xml_writer *writer,
	const char *key, const char *value,
	const char *attrkey, const char *attrvalue)
{
	int r;

	r = xml_writer_start_element(writer, key);
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_start_element() failed: %d", r);
		return (ARCHIVE_FATAL);
	}
	if (attrkey != NULL && attrvalue != NULL) {
		r = xml_writer_write_attribute(writer, attrkey, attrvalue);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_write_attribute() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
	}
	if (value != NULL) {
		r = xml_writer_write_string(writer, value);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_write_string() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
	}
	r = xml_writer_end_element(writer);
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_end_element() failed: %d", r);
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}